

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceCellTarget::UpdateMinDistance
          (S2MinDistanceCellTarget *this,S2Point *v0,S2Point *v1,S2MinDistance *min_dist)

{
  bool bVar1;
  S1ChordAngle x;
  S2MinDistance local_30;
  S2MinDistance *local_28;
  S2MinDistance *min_dist_local;
  S2Point *v1_local;
  S2Point *v0_local;
  S2MinDistanceCellTarget *this_local;
  
  local_28 = min_dist;
  min_dist_local = (S2MinDistance *)v1;
  v1_local = v0;
  v0_local = (S2Point *)this;
  x = S2Cell::GetDistance(&this->cell_,v0,v1);
  S2MinDistance::S2MinDistance(&local_30,x);
  bVar1 = S2MinDistance::UpdateMin(min_dist,&local_30);
  return bVar1;
}

Assistant:

bool S2MinDistanceCellTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MinDistance* min_dist) {
  return min_dist->UpdateMin(S2MinDistance(cell_.GetDistance(v0, v1)));
}